

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::on_finish
          (tag_scalar_t<int,_cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  reference pptVar4;
  parser_info_t<cfgfile::string_trait_t> *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range2;
  string *in_stack_fffffffffffffad8;
  allocator *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  allocator *paVar6;
  exception_t<cfgfile::string_trait_t> *in_stack_fffffffffffffaf0;
  exception_t<cfgfile::string_trait_t> *this_00;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  allocator local_4c1;
  string local_4c0 [103];
  allocator local_459;
  string local_458 [71];
  allocator local_411;
  string local_410 [71];
  undefined1 local_3c9 [72];
  allocator local_381;
  string local_380 [320];
  tag_t<cfgfile::string_trait_t> *local_240;
  tag_t<cfgfile::string_trait_t> **local_238;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_230;
  undefined8 local_228;
  undefined1 local_21a;
  allocator local_219;
  string local_218 [103];
  allocator local_1b1;
  string local_1b0 [71];
  allocator local_169;
  string local_168 [87];
  allocator local_111;
  string local_110 [256];
  parser_info_t<cfgfile::string_trait_t> *local_10;
  
  local_10 = in_RSI;
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined_member_value(in_RDI);
  if (!bVar1) {
    local_21a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Undefined value of tag: \"",&local_111);
    string_trait_t::from_ascii(in_stack_fffffffffffffad8);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    paVar5 = &local_169;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"\". In file \"",paVar5);
    string_trait_t::from_ascii(in_stack_fffffffffffffad8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   in_stack_fffffffffffffb10);
    parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
    std::operator+(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    paVar6 = &local_1b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"\" on line ",paVar6);
    string_trait_t::from_ascii(in_stack_fffffffffffffad8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar6);
    parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffad8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,".",&local_219);
    string_trait_t::from_ascii(in_stack_fffffffffffffad8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar6);
    exception_t<cfgfile::string_trait_t>::exception_t
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    local_21a = 0;
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  iVar2 = (*in_RDI->_vptr_tag_t[2])();
  local_228 = CONCAT44(extraout_var,iVar2);
  local_230._M_current =
       (tag_t<cfgfile::string_trait_t> **)
       std::
       vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
       ::begin((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                *)in_stack_fffffffffffffad8);
  local_238 = (tag_t<cfgfile::string_trait_t> **)
              std::
              vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ::end((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     *)in_stack_fffffffffffffad8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffae0,
                       (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffad8);
    if (!bVar1) {
      return;
    }
    pptVar4 = __gnu_cxx::
              __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
              ::operator*(&local_230);
    local_240 = *pptVar4;
    bVar1 = tag_t<cfgfile::string_trait_t>::is_mandatory(local_240);
    if ((bVar1) &&
       (bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffffaf8), !bVar1))
    break;
    __gnu_cxx::
    __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
    ::operator++(&local_230);
  }
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"Undefined child mandatory tag: \"",&local_381);
  string_trait_t::from_ascii(in_stack_fffffffffffffad8);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(local_240);
  std::operator+(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  this_00 = (exception_t<cfgfile::string_trait_t> *)local_3c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_3c9 + 1),"\". Where parent is: \"",(allocator *)this_00);
  string_trait_t::from_ascii(in_stack_fffffffffffffad8);
  std::operator+(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  paVar6 = &local_411;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"\". In file \"",paVar6);
  string_trait_t::from_ascii(in_stack_fffffffffffffad8);
  std::operator+(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  parser_info_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(local_10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar6,
                 in_stack_fffffffffffffae0);
  paVar5 = &local_459;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"\" on line ",paVar5);
  string_trait_t::from_ascii(in_stack_fffffffffffffad8);
  std::operator+(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  parser_info_t<cfgfile::string_trait_t>::line_number(local_10);
  string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffad8);
  std::operator+(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  paVar5 = &local_4c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,".",paVar5);
  string_trait_t::from_ascii((string *)paVar5);
  std::operator+(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,(string_t *)paVar6);
  __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}